

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v10::detail::write_float<char,fmt::v10::appender,long_double>
                   (appender out,longdouble value,format_specs<char> specs,locale_ref loc)

{
  unkbyte10 Var1;
  undefined2 uVar2;
  int iVar3;
  float_specs fVar4;
  long lVar5;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar6;
  char cVar7;
  uint uVar8;
  uint uVar9;
  int precision;
  ulong uVar10;
  appender out_00;
  float_specs *in_R9;
  appender it;
  bool bVar11;
  longdouble value_00;
  format_specs<char> specs_00;
  float_specs fspecs;
  big_decimal_fp f;
  memory_buffer buffer;
  float_specs local_290;
  format_specs<char> local_288;
  longdouble local_274;
  undefined1 local_268 [16];
  big_decimal_fp local_258;
  buffer<char> local_248;
  char local_228 [504];
  
  local_288._8_8_ = specs._8_8_;
  local_288._0_8_ = specs._0_8_;
  local_274 = value;
  local_268._0_10_ = value;
  Var1 = local_268._0_10_;
  local_268._8_2_ = (undefined2)((unkuint10)value >> 0x40);
  uVar2 = local_268._8_2_;
  local_268._0_10_ = Var1;
  fVar4 = parse_float_type_spec<fmt::v10::detail::error_handler,char>
                    (&local_288,(error_handler *)&local_248);
  uVar8 = fVar4._4_4_ & 0xffff00ff;
  uVar9 = uVar8 + ((ushort)local_288._9_2_ & 0x70) * 0x10;
  local_290.precision = fVar4.precision;
  local_290._4_4_ = uVar9;
  if ((short)uVar2 < 0) {
    uVar9 = uVar8 | 0x100;
    local_290 = (float_specs)((ulong)fVar4 & 0xffff00ffffffffff | 0x10000000000);
    value_00 = -local_274;
  }
  else {
    value_00 = local_274;
    if (((ushort)local_288._9_2_ & 0x70) == 0x10) {
      local_290 = (float_specs)((ulong)fVar4 & 0xffff00ffffffffff);
      uVar9 = uVar8;
    }
  }
  if (value_00 == (longdouble)INFINITY) {
    out_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._1_7_ = 0;
    out_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_1_ =
         NAN(value_00);
    specs_00._8_8_ = &local_290;
    specs_00._0_8_ = local_288._8_8_;
    bVar6.container =
         (buffer<char> *)
         write_nonfinite<char,fmt::v10::appender>
                   (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,out_00
                    ,local_288.width._0_1_,specs_00,in_R9);
  }
  else {
    uVar8 = uVar9;
    if (((local_288._9_2_ & 0xf) == 4) && ((uVar9 & 0xff00) != 0)) {
      cVar7 = ""[uVar9 >> 8 & 0xff];
      lVar5 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container + 0x10);
      uVar10 = lVar5 + 1;
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                    + 0x18) < uVar10) {
        local_274 = value_00;
        (*(code *)**(undefined8 **)
                    out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                  (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
        lVar5 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                container + 0x10);
        uVar10 = lVar5 + 1;
        value_00 = local_274;
      }
      *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                0x10) = uVar10;
      *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                container + 8) + lVar5) = cVar7;
      uVar8 = uVar9 & 0xffff00ff;
      local_290 = (float_specs)(CONCAT44(uVar9,local_290.precision) & 0xffff00ffffffffff);
      if (local_288.width != 0) {
        local_288.width = local_288.width + -1;
      }
    }
    local_248.size_ = 0;
    local_248._vptr_buffer = (_func_int **)&PTR_grow_0025b7f8;
    local_248.capacity_ = 500;
    cVar7 = (char)uVar8;
    local_248.ptr_ = local_228;
    if (cVar7 == '\x03') {
      bVar11 = (uVar8 & 0xff00) != 0;
      if (bVar11) {
        local_228[0] = ""[uVar8 >> 8 & 0xff];
      }
      local_248.size_ = (size_t)bVar11;
      format_hexfloat<long_double,_0>(value_00,local_288.precision,local_290,&local_248);
      local_258.significand = local_248.ptr_;
      local_258.significand_size = (undefined4)local_248.size_;
      local_258.exponent = local_248.size_._4_4_;
      bVar6.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_bytes<(fmt::v10::align::type)2,char,fmt::v10::appender>(fmt::v10::appender,fmt::v10::basic_string_view<char>,fmt::v10::format_specs<char>const&)::_lambda(fmt::v10::appender)_1_&>
                     (out,&local_288,local_248.size_,local_248.size_,
                      (anon_class_16_1_a7b7af8b *)&local_258);
    }
    else {
      precision = 6;
      if (local_288.type == none) {
        precision = local_288.precision;
      }
      if (-1 < (long)local_288._0_8_) {
        precision = local_288.precision;
      }
      if (cVar7 == '\x01') {
        if (precision == 0x7fffffff) {
          throw_format_error("number is too big");
        }
        precision = precision + 1;
      }
      else {
        iVar3 = 1;
        if (precision != 0) {
          iVar3 = precision;
        }
        if (cVar7 != '\x02') {
          precision = iVar3;
        }
      }
      iVar3 = format_float<long_double>(value_00,precision,local_290,&local_248);
      local_290.precision = precision;
      local_258.significand = local_248.ptr_;
      local_258._8_8_ = CONCAT44(iVar3,(int)local_248.size_);
      bVar6.container =
           (buffer<char> *)
           do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>
                     (out,&local_258,&local_288,local_290,loc);
    }
    if (local_248.ptr_ != local_228) {
      operator_delete(local_248.ptr_,local_248.capacity_);
    }
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar6.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_float(OutputIt out, T value,
                                 format_specs<Char> specs, locale_ref loc)
    -> OutputIt {
  float_specs fspecs = parse_float_type_spec(specs);
  fspecs.sign = specs.sign;
  if (detail::signbit(value)) {  // value < 0 is false for NaN so use signbit.
    fspecs.sign = sign::minus;
    value = -value;
  } else if (fspecs.sign == sign::minus) {
    fspecs.sign = sign::none;
  }

  if (!detail::isfinite(value))
    return write_nonfinite(out, detail::isnan(value), specs, fspecs);

  if (specs.align == align::numeric && fspecs.sign) {
    auto it = reserve(out, 1);
    *it++ = detail::sign<Char>(fspecs.sign);
    out = base_iterator(out, it);
    fspecs.sign = sign::none;
    if (specs.width != 0) --specs.width;
  }

  memory_buffer buffer;
  if (fspecs.format == float_format::hex) {
    if (fspecs.sign) buffer.push_back(detail::sign<char>(fspecs.sign));
    format_hexfloat(convert_float(value), specs.precision, fspecs, buffer);
    return write_bytes<align::right>(out, {buffer.data(), buffer.size()},
                                     specs);
  }
  int precision = specs.precision >= 0 || specs.type == presentation_type::none
                      ? specs.precision
                      : 6;
  if (fspecs.format == float_format::exp) {
    if (precision == max_value<int>())
      throw_format_error("number is too big");
    else
      ++precision;
  } else if (fspecs.format != float_format::fixed && precision == 0) {
    precision = 1;
  }
  if (const_check(std::is_same<T, float>())) fspecs.binary32 = true;
  int exp = format_float(convert_float(value), precision, fspecs, buffer);
  fspecs.precision = precision;
  auto f = big_decimal_fp{buffer.data(), static_cast<int>(buffer.size()), exp};
  return write_float(out, f, specs, fspecs, loc);
}